

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O2

int64_t parse_uint(uint8_t *s,size_t len)

{
  int64_t iVar1;
  int64_t iVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar1 = -1;
  iVar2 = iVar1;
  if (len != 0) {
    sVar4 = 0;
    for (lVar3 = 0;
        ((iVar2 = lVar3, len != sVar4 && (iVar2 = iVar1, 0xf5 < (byte)(s[sVar4] - 0x3a))) &&
        (lVar3 < 0xccccccccccccccd)); lVar3 = lVar3 + uVar5) {
      lVar3 = lVar3 * 10;
      uVar5 = (ulong)(s[sVar4] & 0xf);
      uVar6 = uVar5 ^ 0x7fffffffffffffff;
      if (lVar3 - uVar6 != 0 && (long)uVar6 <= lVar3) {
        return -1;
      }
      sVar4 = sVar4 + 1;
    }
  }
  return iVar2;
}

Assistant:

static int64_t parse_uint(const uint8_t *s, size_t len) {
  int64_t n = 0;
  size_t i;
  if (len == 0) {
    return -1;
  }
  for (i = 0; i < len; ++i) {
    if ('0' <= s[i] && s[i] <= '9') {
      if (n > INT64_MAX / 10) {
        return -1;
      }
      n *= 10;
      if (n > INT64_MAX - (s[i] - '0')) {
        return -1;
      }
      n += s[i] - '0';
      continue;
    }
    return -1;
  }
  return n;
}